

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O1

int ncnn::binary_op_2_3_4_20<ncnn::BinaryOp_x86_fma_functor::binary_op_pow>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined1 auVar4 [16];
  int iVar5;
  __m128 *pafVar6;
  int iVar7;
  undefined8 *puVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  float fVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  __m128 afVar17;
  binary_op_pow op;
  __m128 _a0;
  __m128 _p_1;
  __m256 _a0_avx;
  binary_op_pow local_10d;
  int local_10c;
  ulong local_108;
  Mat *local_100;
  Mat *local_f8;
  Mat *local_f0;
  ulong local_e8;
  __m128 local_e0;
  float afStack_d0 [2];
  float afStack_c8 [6];
  float local_b0 [2];
  float afStack_a8 [2];
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float local_80;
  float fStack_7c;
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  
  iVar7 = b->h;
  iVar1 = b->w;
  iVar2 = b->d;
  local_108 = (ulong)(uint)b->c;
  iVar3 = b->elempack;
  local_f8 = a;
  local_f0 = b;
  Mat::create_like(c,b,opt->blob_allocator);
  iVar5 = -100;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    if (0 < (int)local_108) {
      local_e8 = 0;
      local_10c = iVar7 * iVar1 * iVar2 * iVar3;
      local_100 = c;
      do {
        pafVar6 = (__m128 *)(local_f0->cstep * local_e8 * local_f0->elemsize + (long)local_f0->data)
        ;
        puVar8 = (undefined8 *)
                 (local_100->cstep * local_e8 * local_100->elemsize + (long)local_100->data);
        local_a0 = *local_f8->data;
        fStack_9c = local_a0;
        fStack_98 = local_a0;
        fStack_94 = local_a0;
        fStack_90 = local_a0;
        fStack_8c = local_a0;
        fStack_88 = local_a0;
        fStack_84 = local_a0;
        local_80 = local_a0;
        fStack_7c = local_a0;
        fStack_78 = local_a0;
        fStack_74 = local_a0;
        fStack_70 = local_a0;
        fStack_6c = local_a0;
        fStack_68 = local_a0;
        fStack_64 = local_a0;
        if (local_10c < 8) {
          uVar9 = 0;
        }
        else {
          uVar10 = 0;
          do {
            uVar14 = *(undefined8 *)*pafVar6;
            uVar13 = *(undefined8 *)(*pafVar6 + 2);
            local_e0 = *pafVar6;
            uVar15 = *(undefined8 *)pafVar6[1];
            uVar16 = *(undefined8 *)(pafVar6[1] + 2);
            afStack_d0 = (float  [2])uVar15;
            afStack_c8._0_8_ = uVar16;
            BinaryOp_x86_fma_functor::binary_op_pow::func_pack8
                      (&local_10d,(__m256 *)&local_80,(__m256 *)local_e0);
            *puVar8 = uVar14;
            puVar8[1] = uVar13;
            puVar8[2] = uVar15;
            puVar8[3] = uVar16;
            pafVar6 = pafVar6 + 2;
            puVar8 = puVar8 + 4;
            uVar9 = uVar10 + 8;
            iVar7 = uVar10 + 0xf;
            uVar10 = uVar9;
          } while (iVar7 < local_10c);
        }
        auVar4._4_4_ = fStack_9c;
        auVar4._0_4_ = local_a0;
        auVar4._8_4_ = fStack_98;
        auVar4._12_4_ = fStack_94;
        local_e0 = (__m128)vpermilps_avx(auVar4,0);
        uVar10 = uVar9;
        if ((int)(uVar9 | 3) < local_10c) {
          do {
            local_b0 = *(float (*) [2])*pafVar6;
            uVar14 = *(undefined8 *)(*pafVar6 + 2);
            afStack_a8 = (float  [2])uVar14;
            afVar17 = BinaryOp_x86_fma_functor::binary_op_pow::func_pack4
                                (&local_10d,&local_e0,(__m128 *)local_b0);
            *puVar8 = afVar17._0_8_;
            puVar8[1] = uVar14;
            pafVar6 = pafVar6 + 1;
            puVar8 = puVar8 + 2;
            uVar9 = uVar10 + 4;
            iVar7 = uVar10 + 7;
            uVar10 = uVar9;
          } while (iVar7 < local_10c);
        }
        iVar7 = local_10c - uVar9;
        if ((int)uVar9 < local_10c) {
          lVar11 = 0;
          do {
            fVar12 = powf(local_a0,(*pafVar6)[lVar11]);
            *(float *)((long)puVar8 + lVar11 * 4) = fVar12;
            lVar11 = lVar11 + 1;
          } while (iVar7 != (int)lVar11);
        }
        local_e8 = local_e8 + 1;
      } while (local_e8 != local_108);
    }
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

static int binary_op_2_3_4_20(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = b.w;
    int h = b.h;
    int d = b.d;
    int channels = b.c;
    int elempack = b.elempack;
    int size = w * h * d * elempack;

    // type 2 3 4 20
    c.create_like(b, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float a0 = a[0];
        const float* ptr = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _a0_avx512 = _mm512_set1_ps(a0);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _outp = op.func_pack16(_a0_avx512, _p);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        __m256 _a0_avx = _mm256_set1_ps(a0);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = op.func_pack8(_a0_avx, _p);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        __m128 _a0 = _mm_set1_ps(a0);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _outp = op.func_pack4(_a0, _p);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(a0, *ptr);
            ptr += 1;
            outptr += 1;
        }
    }

    return 0;
}